

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall kratos::VarFanOutVisitor::visit(VarFanOutVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  Var *pVVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  uint64_t i;
  ulong uVar5;
  pointer pbVar6;
  pointer *this_00;
  long lVar7;
  shared_ptr<kratos::AssignStmt> *stmt_00;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  undefined1 auStack_a8 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  debug_info;
  shared_ptr<kratos::Stmt> local_88;
  undefined1 auStack_78 [8];
  vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
  chain;
  shared_ptr<kratos::Var> var;
  shared_ptr<kratos::AssignStmt> stmt;
  
  Generator::get_all_var_names_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d0,generator);
  while (local_d0 !=
         (undefined1  [8])
         var_names.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &chain.
               super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Generator::get_var((Generator *)this_00,(string *)generator);
    auStack_78 = (undefined1  [8])0x0;
    chain.
    super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chain.
    super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    compute_assign_chain
              ((shared_ptr<kratos::Var> *)this_00,
               (vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                *)auStack_78);
    pbVar6 = (pointer)local_d0;
    if (0x40 < (ulong)((long)chain.
                             super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78)) {
      auStack_a8 = (undefined1  [8])0x0;
      debug_info.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      debug_info.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar7 = 0x10;
      uVar5 = 0;
      var_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d0;
      do {
        pVVar2 = *(Var **)((long)&(((shared_ptr<kratos::AssignStmt> *)((long)auStack_78 + 0x10))->
                                  super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + lVar7);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(((shared_ptr<kratos::AssignStmt> *)((long)auStack_78 + 0x10))->
                          super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>).
                          _M_refcount._M_pi + lVar7);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        stmt_00 = (shared_ptr<kratos::AssignStmt> *)
                  ((long)&(((shared_ptr<kratos::Var> *)auStack_78)->
                          super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                  lVar7);
        if (generator->debug == true) {
          peVar4 = (stmt_00->super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)auStack_a8,
                     debug_info.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (peVar4->super_Stmt).super_IRNode.fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     *(pointer *)
                      ((long)&(peVar4->super_Stmt).super_IRNode.fn_name_ln.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ._M_impl + 8));
        }
        Var::unassign(pVVar2,stmt_00);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        uVar5 = uVar5 + 1;
        lVar7 = lVar7 + 0x20;
      } while (uVar5 < ((long)chain.
                              super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78 >> 5) -
                       1U);
      pVVar2 = chain.
               super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].first.
               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var3 = chain.
               super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].first.
               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      Var::move_src_to((Var *)chain.
                              super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pVVar2,generator,
                       false);
      if ((*(int *)&chain.
                    super__Vector_base<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[0xb].first.
                    super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           4) && (pVVar2->type_ == PortIO)) {
        Var::assign((Var *)&var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(shared_ptr<kratos::Var> *)pVVar2,(int)&chain + 0x10);
        if (generator->debug == true) {
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)&(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count,
                      (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)auStack_a8);
          stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = 0xee;
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<char_const(&)[81],int>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)&(var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count,
                     (char (*) [81])
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                     ,(int *)((long)&stmt.
                                     super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 4));
        }
        local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar1 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar1 = &((stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        Generator::add_stmt(generator,&local_88);
        if ((element_type *)
            local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
        }
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_a8);
      pbVar6 = var_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    std::
    vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::pair<std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::AssignStmt>_>_>_>
               *)auStack_78);
    if (var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    local_d0 = (undefined1  [8])(pbVar6 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  return;
}

Assistant:

void visit(Generator* generator) override {
        auto var_names = generator->get_all_var_names();
        for (auto const& var_name : var_names) {
            auto var = generator->get_var(var_name);
            std::vector<std::pair<std::shared_ptr<Var>, std::shared_ptr<AssignStmt>>> chain;
            compute_assign_chain(var, chain);
            if (chain.size() <= 2) continue;  // nothing to be done

            std::vector<std::pair<std::string, uint32_t>> debug_info;

            for (uint64_t i = 0; i < chain.size() - 1; i++) {
                auto& [pre, stmt] = chain[i];
                auto next = chain[i + 1].first;

                // insert debug info
                if (generator->debug) {
                    debug_info.insert(debug_info.end(), stmt->fn_name_ln.begin(),
                                      stmt->fn_name_ln.end());
                }

                next->unassign(stmt);
            }

            auto dst = chain.back().first;
            Var::move_src_to(var.get(), dst.get(), generator, false);
            // if both of them are ports, we need to add a statement
            if (var->type() == VarType::PortIO && dst->type() == VarType::PortIO) {
                // need to add a top assign statement
                auto stmt = dst->assign(var, AssignmentType::Blocking);
                if (generator->debug) {
                    // copy every vars definition over
                    stmt->fn_name_ln = debug_info;
                    stmt->fn_name_ln.emplace_back(__FILE__, __LINE__);
                }
                generator->add_stmt(stmt);
            }
        }
    }